

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_59::InMemoryFile::copy(InMemoryFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint64_t uVar1;
  Impl *pIVar2;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> WVar3;
  uint64_t in_RCX;
  unsigned_long local_c8;
  ArrayPtr<unsigned_char> local_c0;
  InMemoryFile *local_b0;
  size_t n;
  size_t local_98;
  uint64_t end;
  undefined1 local_88 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  undefined1 local_70 [8];
  uchar *local_68;
  uchar *local_40;
  size_t fromFileSize;
  uint64_t copySize_local;
  uint64_t fromOffset_local;
  ReadableFile *from_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  copySize_local = in_RCX;
  fromOffset_local = (uint64_t)src;
  from_local = (ReadableFile *)dst;
  offset_local = (uint64_t)this;
  (**(code **)(*(long *)src + 0x10))(local_70);
  local_40 = local_68;
  if (copySize_local < local_68) {
    lock.ptr = (Impl *)(local_68 + -copySize_local);
    fromFileSize = min<unsigned_long&,unsigned_long>(&fromFileSize,(unsigned_long *)&lock.ptr);
    if (fromFileSize == 0) {
      this_local = (InMemoryFile *)0x0;
    }
    else {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88,&this->impl
                );
      local_98 = (long)&(from_local->super_FsNode)._vptr_FsNode + fromFileSize;
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
      Impl::ensureCapacity(pIVar2,local_98);
      uVar1 = fromOffset_local;
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
      local_c0 = Array<unsigned_char>::slice(&pIVar2->bytes,(size_t)from_local,local_98);
      local_b0 = (InMemoryFile *)
                 (**(code **)(*(long *)uVar1 + 0x30))
                           (uVar1,copySize_local,local_c0.ptr,local_c0.size_);
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
      local_c8 = (long)&(from_local->super_FsNode)._vptr_FsNode +
                 (long)&(local_b0->super_File).super_ReadableFile;
      WVar3 = max<unsigned_long&,unsigned_long>(&pIVar2->size,&local_c8);
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
      pIVar2->size = WVar3;
      pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
      Impl::modified(pIVar2);
      this_local = local_b0;
      Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
    }
  }
  else {
    this_local = (InMemoryFile *)0x0;
  }
  return (int)this_local;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t copySize) const override {
    size_t fromFileSize = from.stat().size;
    if (fromFileSize <= fromOffset) return 0;

    // Clamp size to EOF.
    copySize = kj::min(copySize, fromFileSize - fromOffset);
    if (copySize == 0) return 0;

    auto lock = impl.lockExclusive();

    // Allocate space for the copy.
    uint64_t end = offset + copySize;
    lock->ensureCapacity(end);

    // Read directly into our backing store.
    size_t n = from.read(fromOffset, lock->bytes.slice(offset, end));
    lock->size = kj::max(lock->size, offset + n);

    lock->modified();
    return n;
  }